

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
          *f)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  char __tmp;
  char local_5a;
  char local_59;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  ulong local_48;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
  *local_40;
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_38;
  
  uVar3 = (ulong)spec->width_;
  uVar1 = f->size_;
  lVar4 = uVar1 - uVar3;
  if (uVar3 <= uVar1) {
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
                  *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
    return;
  }
  local_5a = (char)spec->fill_;
  uVar2 = uVar3 - uVar1;
  if (spec->align_ == ALIGN_CENTER) {
    uVar5 = uVar2 >> 1;
    local_58._M_stream = *(ostream_type **)this;
    local_58._M_string = *(char **)(this + 8);
    uVar6 = uVar5;
    cVar7 = local_5a;
    if (1 < uVar2) {
      local_59 = local_5a;
      local_48 = uVar5;
      local_40 = f;
      local_38 = (ostream_iterator<char,_char,_std::char_traits<char>_> *)this;
      do {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a);
        uVar5 = uVar5 - 1;
        f = local_40;
        uVar6 = local_48;
        this = (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                *)local_38;
        cVar7 = local_59;
      } while (uVar5 != 0);
    }
    ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_stream = local_58._M_stream;
    ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_string = local_58._M_string;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
                  *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
    local_58._M_stream = ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_stream;
    local_58._M_string = ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_string;
    if (uVar2 != uVar6) {
      lVar4 = (uVar1 + uVar6) - uVar3;
      local_5a = cVar7;
      do {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0);
    }
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      local_58._M_stream = *(ostream_type **)this;
      local_58._M_string = *(char **)(this + 8);
      if (uVar2 != 0) {
        lVar4 = uVar1 - uVar3;
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a)
          ;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0);
      }
      *(ostream_type **)this = local_58._M_stream;
      *(char **)(this + 8) = local_58._M_string;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
                    *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
      return;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
                  *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
    local_58._M_stream = *(ostream_type **)this;
    local_58._M_string = *(char **)(this + 8);
    if (uVar2 != 0) {
      do {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0);
    }
  }
  ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_stream = local_58._M_stream;
  ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this)->_M_string = local_58._M_string;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }